

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall pstd::pmr::monotonic_buffer_resource::release(monotonic_buffer_resource *this)

{
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  *plVar1;
  _List_node_base *p_Var2;
  
  plVar1 = &this->usedBlocks;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)plVar1) {
    (*this->upstreamResource->_vptr_memory_resource[3])
              (this->upstreamResource,p_Var2[1]._M_next,p_Var2[1]._M_prev,0x10);
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(plVar1);
  plVar1 = &this->availableBlocks;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)plVar1) {
    (*this->upstreamResource->_vptr_memory_resource[3])
              (this->upstreamResource,p_Var2[1]._M_next,p_Var2[1]._M_prev,0x10);
  }
  std::__cxx11::
  list<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::clear(plVar1);
  (*this->upstreamResource->_vptr_memory_resource[3])
            (this->upstreamResource,(this->currentBlock).ptr,(this->currentBlock).size,0x10);
  (this->currentBlock).ptr = (void *)0x0;
  (this->currentBlock).size = 0;
  return;
}

Assistant:

void release() {
        for (const auto &block : usedBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        usedBlocks.clear();

        for (const auto &block : availableBlocks)
            upstreamResource->deallocate(block.ptr, block.size);
        availableBlocks.clear();

        upstreamResource->deallocate(currentBlock.ptr, currentBlock.size);
        currentBlock = MemoryBlock();
    }